

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_info.cc
# Opt level: O2

void __thiscall SystemInfo::SetOsBit(SystemInfo *this)

{
  bool bVar1;
  string bit;
  utsname unameData;
  allocator local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  utsname local_196;
  
  std::__cxx11::string::assign((char *)&this->os_bit_);
  uname(&local_196);
  std::__cxx11::string::string((string *)&local_1b8,local_196.machine,&local_1b9);
  bVar1 = std::operator==(&local_1b8,"x86_64");
  if ((bVar1) || (bVar1 = std::operator==(&local_1b8,"i686"), bVar1)) {
    std::__cxx11::string::assign((char *)&this->os_bit_);
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

void SystemInfo::SetOsBit()
{
    os_bit_ = "";

#if defined(YACCLAB_WINDOWS)
    // Compiler independent, works on Windows
    typedef BOOL(WINAPI *LPFN_ISWOW64PROCESS) (HANDLE, PBOOL);
    LPFN_ISWOW64PROCESS fnIsWow64Process;
    BOOL bIsWow64 = FALSE;

    //IsWow64Process is not available on all supported versions of Windows.
    //Use GetModuleHandle to get a handle to the DLL that contains the function
    //and GetProcAddress to get a pointer to the function if available.

    fnIsWow64Process = (LPFN_ISWOW64PROCESS)GetProcAddress(
        GetModuleHandle(TEXT("kernel32")), "IsWow64Process");

    if (NULL != fnIsWow64Process) {
        if (!fnIsWow64Process(GetCurrentProcess(), &bIsWow64)) {
            //handle error
            return;
        }
    }
    if (bIsWow64)
        os_bit_ = "64 bit";
    else
        os_bit_ = "32 bit";

#elif defined(YACCLAB_LINUX) || defined(YACCLAB_UNIX)
    struct utsname unameData;
    uname(&unameData);
    string bit = unameData.machine;
    if (bit == "x86_64")
        os_bit_ = "64 bit";
    else if (bit == "i686")
        os_bit_ = "32 bit";
#elif defined(YACCLAB_APPLE)
    // TODO
#endif
}